

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int robust_open(char *z,int f,mode_t m)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  long in_FS_OFFSET;
  stat statbuf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0x1a4;
  if (m != 0) {
    uVar5 = m;
  }
  do {
    while (uVar2 = (*aSyscall[0].pCurrent)(z,(ulong)(f | 0x80000),(ulong)uVar5), (int)uVar2 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 != 4) goto LAB_0012fe94;
    }
    if (2 < uVar2) {
      if (m != 0) {
        memset(&statbuf,0xaa,0x90);
        iVar3 = (*aSyscall[5].pCurrent)((ulong)uVar2,&statbuf);
        if (((iVar3 == 0) && (statbuf.st_size == 0)) && ((statbuf.st_mode & 0x1ff) != m)) {
          (*aSyscall[0xe].pCurrent)((ulong)uVar2,(ulong)m);
        }
      }
      goto LAB_0012fe94;
    }
    if ((f & 0xc0U) == 0xc0) {
      (*aSyscall[0x10].pCurrent)(z);
    }
    (*aSyscall[1].pCurrent)((ulong)uVar2);
    sqlite3_log(0x1c,"attempt to open \"%s\" as file descriptor %d",z,(ulong)uVar2);
    iVar3 = (*aSyscall[0].pCurrent)("/dev/null",0,(ulong)m);
  } while (-1 < iVar3);
  uVar2 = 0xffffffff;
LAB_0012fe94:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

static int robust_open(const char *z, int f, mode_t m){
  int fd;
  mode_t m2 = m ? m : SQLITE_DEFAULT_FILE_PERMISSIONS;
  while(1){
#if defined(O_CLOEXEC)
    fd = osOpen(z,f|O_CLOEXEC,m2);
#else
    fd = osOpen(z,f,m2);
#endif
    if( fd<0 ){
      if( errno==EINTR ) continue;
      break;
    }
    if( fd>=SQLITE_MINIMUM_FILE_DESCRIPTOR ) break;
    if( (f & (O_EXCL|O_CREAT))==(O_EXCL|O_CREAT) ){
      (void)osUnlink(z);
    }
    osClose(fd);
    sqlite3_log(SQLITE_WARNING,
                "attempt to open \"%s\" as file descriptor %d", z, fd);
    fd = -1;
    if( osOpen("/dev/null", O_RDONLY, m)<0 ) break;
  }
  if( fd>=0 ){
    if( m!=0 ){
      struct stat statbuf;
      if( osFstat(fd, &statbuf)==0
       && statbuf.st_size==0
       && (statbuf.st_mode&0777)!=m
      ){
        osFchmod(fd, m);
      }
    }
#if defined(FD_CLOEXEC) && (!defined(O_CLOEXEC) || O_CLOEXEC==0)
    osFcntl(fd, F_SETFD, osFcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
  }
  return fd;
}